

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeConstruct(Builder *this,Id typeId,Vector<Id> *constituents)

{
  Block *this_00;
  Vector<Id> *members;
  bool bVar1;
  int iVar2;
  Id IVar3;
  size_type sVar4;
  Instruction *pIVar5;
  const_reference pvVar6;
  size_t size;
  bool bVar7;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_60;
  int local_58;
  int c;
  Instruction *local_48;
  Instruction *op;
  uint *local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_30;
  Vector<Id> *local_28;
  Vector<Id> *constituents_local;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  size = (size_t)typeId;
  local_28 = constituents;
  constituents_local._4_4_ = typeId;
  pBStack_18 = this;
  bVar1 = isAggregateType(this,typeId);
  bVar7 = true;
  if (!bVar1) {
    size = (size_t)constituents_local._4_4_;
    iVar2 = getNumTypeConstituents(this,constituents_local._4_4_);
    bVar7 = false;
    if (1 < iVar2) {
      size = (size_t)constituents_local._4_4_;
      iVar2 = getNumTypeConstituents(this,constituents_local._4_4_);
      sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                        (local_28);
      bVar7 = iVar2 == (int)sVar4;
    }
  }
  IVar3 = constituents_local._4_4_;
  members = local_28;
  if (bVar7) {
    if ((this->generatingOpCodeForSpecConst & 1U) == 0) {
      pIVar5 = (Instruction *)Instruction::operator_new((Instruction *)0x38,size);
      IVar3 = getUniqueId(this);
      Instruction::Instruction(pIVar5,IVar3,constituents_local._4_4_,OpCompositeConstruct);
      local_48 = pIVar5;
      for (local_58 = 0; iVar2 = local_58,
          sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                            (local_28), pIVar5 = local_48, iVar2 < (int)sVar4;
          local_58 = local_58 + 1) {
        pvVar6 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                 operator[](local_28,(long)local_58);
        Instruction::addIdOperand(pIVar5,*pvVar6);
      }
      this_00 = this->buildPoint;
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_60,
                 local_48);
      Block::addInstruction(this_00,&local_60);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_60);
      this_local._4_4_ = Instruction::getResultId(local_48);
    }
    else {
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::begin
                             (local_28);
      local_38 = (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
                         end(local_28);
      op = (Instruction *)this;
      bVar7 = std::
              any_of<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>>,spv::Builder::createCompositeConstruct(unsigned_int,std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>const&)::__0>
                        (local_30,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
                                   )local_38,(anon_class_8_1_8991fb9c_for__M_pred)this);
      this_local._4_4_ = makeCompositeConstant(this,IVar3,members,bVar7);
    }
    return this_local._4_4_;
  }
  __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                ,0x7be,"Id spv::Builder::createCompositeConstruct(Id, const dxil_spv::Vector<Id> &)"
               );
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const dxil_spv::Vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size()));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    Instruction* op = new Instruction(getUniqueId(), typeId, OpCompositeConstruct);
    for (int c = 0; c < (int)constituents.size(); ++c)
        op->addIdOperand(constituents[c]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}